

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O0

void r4mat_print_some(int m,int n,float *a,int ilo,int jlo,int ihi,int jhi,string *title)

{
  int iVar1;
  _Setw _Var2;
  int iVar3;
  ostream *poVar4;
  int local_3c;
  int j2lo;
  int j2hi;
  int j;
  int i2lo;
  int i2hi;
  int i;
  int ihi_local;
  int jlo_local;
  int ilo_local;
  float *a_local;
  int n_local;
  int m_local;
  
  std::operator<<((ostream *)&std::cout,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)title);
  std::operator<<(poVar4,"\n");
  if ((m < 1) || (local_3c = jlo, n < 1)) {
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"  (None)\n");
  }
  else {
    for (; local_3c <= jhi; local_3c = local_3c + 5) {
      iVar1 = i4_min(local_3c + 4,n);
      iVar1 = i4_min(iVar1,jhi);
      std::operator<<((ostream *)&std::cout,"\n");
      std::operator<<((ostream *)&std::cout,"  Col:    ");
      for (j2lo = local_3c; j2lo <= iVar1; j2lo = j2lo + 1) {
        _Var2 = std::setw(7);
        poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,j2lo + -1);
        std::operator<<(poVar4,"       ");
      }
      std::operator<<((ostream *)&std::cout,"\n");
      std::operator<<((ostream *)&std::cout,"  Row\n");
      std::operator<<((ostream *)&std::cout,"\n");
      i2lo = i4_max(ilo,1);
      iVar3 = i4_min(ihi,m);
      for (; i2lo <= iVar3; i2lo = i2lo + 1) {
        _Var2 = std::setw(5);
        poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,i2lo + -1);
        std::operator<<(poVar4,": ");
        for (j2lo = local_3c; j2lo <= iVar1; j2lo = j2lo + 1) {
          _Var2 = std::setw(0xc);
          poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,a[i2lo + -1 + (j2lo + -1) * m]);
          std::operator<<(poVar4,"  ");
        }
        std::operator<<((ostream *)&std::cout,"\n");
      }
    }
  }
  return;
}

Assistant:

void r4mat_print_some ( int m, int n, float a[], int ilo, int jlo, int ihi,
  int jhi, string title )

//****************************************************************************80
//
//  Purpose:
//
//    R4MAT_PRINT_SOME prints some of an R4MAT.
//
//  Discussion:
//
//    An R4MAT is a doubly dimensioned array of R4 values, stored as a vector
//    in column-major order.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    20 August 2010
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, the number of rows of the matrix.
//    M must be positive.
//
//    Input, int N, the number of columns of the matrix.
//    N must be positive.
//
//    Input, float A[M*N], the matrix.
//
//    Input, int ILO, JLO, IHI, JHI, designate the first row and
//    column, and the last row and column to be printed.
//
//    Input, string TITLE, a title.
//
{
# define INCX 5

  int i;
  int i2hi;
  int i2lo;
  int j;
  int j2hi;
  int j2lo;

  cout << "\n";
  cout << title << "\n";

  if ( m <= 0 || n <= 0 )
  {
    cout << "\n";
    cout << "  (None)\n";
    return;
  }
//
//  Print the columns of the matrix, in strips of 5.
//
  for ( j2lo = jlo; j2lo <= jhi; j2lo = j2lo + INCX )
  {
    j2hi = j2lo + INCX - 1;
    j2hi = i4_min ( j2hi, n );
    j2hi = i4_min ( j2hi, jhi );

    cout << "\n";
//
//  For each column J in the current range...
//
//  Write the header.
//
    cout << "  Col:    ";
    for ( j = j2lo; j <= j2hi; j++ )
    {
      cout << setw(7) << j - 1 << "       ";
    }
    cout << "\n";
    cout << "  Row\n";
    cout << "\n";
//
//  Determine the range of the rows in this strip.
//
    i2lo = i4_max ( ilo, 1 );
    i2hi = i4_min ( ihi, m );

    for ( i = i2lo; i <= i2hi; i++ )
    {
//
//  Print out (up to) 5 entries in row I, that lie in the current strip.
//
      cout << setw(5) << i - 1 << ": ";
      for ( j = j2lo; j <= j2hi; j++ )
      {
        cout << setw(12) << a[i-1+(j-1)*m] << "  ";
      }
      cout << "\n";
    }
  }

  return;
# undef INCX
}